

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_UnwrapKey
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_MECHANISM_PTR pMechanism,
          CK_OBJECT_HANDLE hUnwrappingKey,CK_BYTE_PTR pWrappedKey,CK_ULONG ulWrappedKeyLen,
          CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,CK_OBJECT_HANDLE_PTR hKey)

{
  undefined8 *__s1;
  byte bVar1;
  bool bVar2;
  byte bVar3;
  undefined4 uVar4;
  uint uVar5;
  int iVar6;
  CK_RV CVar7;
  ulong uVar8;
  CK_STATE CVar9;
  long lVar10;
  pointer ppVar11;
  size_t sVar12;
  uchar *__s2;
  size_t sVar13;
  SoftHSM *value_00;
  long *plVar14;
  CK_ATTRIBUTE_PTR p_Var15;
  long *in_RDX;
  long in_RDI;
  long in_R8;
  ulong in_R9;
  CK_ATTRIBUTE_PTR in_stack_00000008;
  ulong in_stack_00000010;
  long *in_stack_00000018;
  int in_stack_000000d4;
  CK_OBJECT_HANDLE_PTR in_stack_000000d8;
  CK_ULONG in_stack_000000e0;
  CK_ATTRIBUTE_PTR in_stack_000000e8;
  CK_SESSION_HANDLE in_stack_000000f0;
  SoftHSM *in_stack_000000f8;
  OSObject *obj;
  ByteString value_1;
  bool bOK;
  OSObject *osobject;
  ByteString keydata;
  ByteString wrapped;
  ByteString value;
  CK_ULONG i_1;
  CK_ATTRIBUTE *attr;
  const_iterator it;
  attrmap_type *map;
  OSAttribute unwrapAttr;
  CK_ULONG i;
  CK_ULONG secretAttribsCount;
  CK_ATTRIBUTE secretAttribs [32];
  CK_ULONG maxAttribs;
  bool isImplicit;
  CK_CERTIFICATE_TYPE dummy;
  CK_BBOOL isPrivate;
  CK_BBOOL isOnToken;
  CK_KEY_TYPE keyType;
  CK_OBJECT_CLASS objClass;
  CK_BBOOL isUnwrapKeyPrivate;
  CK_BBOOL isUnwrapKeyOnToken;
  OSObject *unwrapKey;
  Token *token;
  CK_RV rv;
  Session *session;
  Session *in_stack_fffffffffffff718;
  Session *this_00;
  undefined4 in_stack_fffffffffffff720;
  undefined4 in_stack_fffffffffffff724;
  SoftHSM *in_stack_fffffffffffff728;
  size_t in_stack_fffffffffffff730;
  undefined4 in_stack_fffffffffffff738;
  undefined1 in_stack_fffffffffffff73c;
  undefined1 in_stack_fffffffffffff73d;
  undefined1 in_stack_fffffffffffff73e;
  undefined1 in_stack_fffffffffffff73f;
  undefined1 in_stack_fffffffffffff740;
  undefined1 in_stack_fffffffffffff741;
  undefined1 in_stack_fffffffffffff742;
  undefined1 in_stack_fffffffffffff743;
  undefined1 in_stack_fffffffffffff744;
  undefined1 in_stack_fffffffffffff745;
  undefined1 in_stack_fffffffffffff746;
  undefined1 in_stack_fffffffffffff747;
  OSObject *in_stack_fffffffffffff748;
  SoftHSM *pSVar16;
  uint6 in_stack_fffffffffffff750;
  undefined1 in_stack_fffffffffffff756;
  byte in_stack_fffffffffffff757;
  ByteString *in_stack_fffffffffffff758;
  undefined6 in_stack_fffffffffffff760;
  byte in_stack_fffffffffffff766;
  byte in_stack_fffffffffffff767;
  SoftHSM *in_stack_fffffffffffff768;
  byte local_88a;
  SoftHSM *in_stack_fffffffffffff778;
  undefined5 in_stack_fffffffffffff780;
  undefined1 in_stack_fffffffffffff785;
  undefined1 in_stack_fffffffffffff786;
  undefined1 in_stack_fffffffffffff787;
  OSAttribute *in_stack_fffffffffffff788;
  undefined1 *local_7f8;
  undefined1 local_7d0 [56];
  CK_MECHANISM_PTR in_stack_fffffffffffff868;
  ByteString *in_stack_fffffffffffff870;
  SoftHSM *in_stack_fffffffffffff878;
  Token *in_stack_fffffffffffff880;
  ByteString *in_stack_fffffffffffff888;
  CK_MECHANISM_PTR in_stack_fffffffffffff890;
  SoftHSM *in_stack_fffffffffffff898;
  undefined1 local_730 [47];
  byte local_701;
  undefined1 local_700 [63];
  undefined1 in_stack_fffffffffffff93f;
  Token *in_stack_fffffffffffff940;
  ByteString *in_stack_fffffffffffff948;
  OSObject *in_stack_fffffffffffff950;
  SoftHSM *in_stack_fffffffffffff958;
  undefined1 local_658 [56];
  undefined1 in_stack_fffffffffffffa3f;
  Token *in_stack_fffffffffffffa40;
  undefined7 in_stack_fffffffffffffa48;
  OSObject *in_stack_fffffffffffffa50;
  SoftHSM *in_stack_fffffffffffffa58;
  bool local_509;
  char local_500 [47];
  undefined1 in_stack_fffffffffffffb2f;
  Token *in_stack_fffffffffffffb30;
  ByteString *in_stack_fffffffffffffb38;
  OSObject *in_stack_fffffffffffffb40;
  SoftHSM *in_stack_fffffffffffffb48;
  ulong local_480;
  CK_ATTRIBUTE_TYPE *local_478;
  _Self local_470;
  _Self local_468;
  map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
  *local_460;
  OSAttribute local_448;
  ulong local_3a8;
  ulong local_3a0;
  CK_ATTRIBUTE_TYPE local_398;
  undefined8 *local_390;
  unsigned_long local_388 [2];
  undefined1 *local_378;
  undefined8 local_370;
  undefined8 local_368;
  undefined1 *local_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined1 *local_348;
  undefined8 local_340;
  undefined1 local_338 [583];
  undefined1 in_stack_ffffffffffffff0f;
  Token *in_stack_ffffffffffffff10;
  ByteString *in_stack_ffffffffffffff18;
  OSObject *in_stack_ffffffffffffff20;
  SoftHSM *in_stack_ffffffffffffff28;
  undefined1 auStack_98 [8];
  undefined8 local_90;
  undefined1 local_81;
  CK_CERTIFICATE_TYPE local_80;
  undefined1 local_72 [106];
  CK_RV local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    return 400;
  }
  if (in_RDX == (long *)0x0) {
    return 7;
  }
  if (in_R8 == 0) {
    return 7;
  }
  if (in_stack_00000008 == (CK_ATTRIBUTE_PTR)0x0) {
    return 7;
  }
  if (in_stack_00000018 == (long *)0x0) {
    return 7;
  }
  local_72._58_8_ = in_R9;
  local_72._82_8_ = in_RDX;
  local_72._50_8_ =
       HandleManager::getSession
                 ((HandleManager *)in_stack_fffffffffffff768,
                  CONCAT17(in_stack_fffffffffffff767,
                           CONCAT16(in_stack_fffffffffffff766,in_stack_fffffffffffff760)));
  if ((Session *)local_72._50_8_ == (Session *)0x0) {
    return 0xb3;
  }
  lVar10 = *(long *)local_72._82_8_;
  if (lVar10 != 1) {
    if (lVar10 == 9) {
      CVar7 = MechParamCheckRSAPKCSOAEP
                        (in_stack_fffffffffffff728,
                         (CK_MECHANISM_PTR)
                         CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720));
      if (CVar7 != 0) {
        return CVar7;
      }
      local_72._42_8_ = 0;
    }
    else if (lVar10 == 0x136) {
      if ((*(long *)(local_72._82_8_ + 8) == 0) || (*(long *)(local_72._82_8_ + 0x10) != 8)) {
        return 7;
      }
    }
    else if (lVar10 == 0x1085) {
      if ((*(long *)(local_72._82_8_ + 8) == 0) || (*(long *)(local_72._82_8_ + 0x10) != 0x10)) {
        return 7;
      }
    }
    else if (lVar10 == 0x2109) {
      if (((ulong)local_72._58_8_ < 0x18) || ((local_72._58_8_ & 7) != 0)) {
        return 0x112;
      }
      if ((*(long *)(local_72._82_8_ + 8) != 0) || (*(long *)(local_72._82_8_ + 0x10) != 0)) {
        return 7;
      }
    }
    else {
      if (lVar10 != 0x210a) {
        return 0x70;
      }
      if (((ulong)local_72._58_8_ < 0x10) || ((local_72._58_8_ & 7) != 0)) {
        return 0x112;
      }
      if ((*(long *)(local_72._82_8_ + 8) != 0) || (*(long *)(local_72._82_8_ + 0x10) != 0)) {
        return 7;
      }
    }
  }
  local_72._34_8_ = Session::getToken((Session *)local_72._50_8_);
  if ((Token *)local_72._34_8_ == (Token *)0x0) {
    return 5;
  }
  local_72._26_8_ =
       HandleManager::getObject
                 ((HandleManager *)in_stack_fffffffffffff768,
                  CONCAT17(in_stack_fffffffffffff767,
                           CONCAT16(in_stack_fffffffffffff766,in_stack_fffffffffffff760)));
  if (((long *)local_72._26_8_ == (long *)0x0) ||
     (uVar8 = (**(code **)(*(long *)local_72._26_8_ + 0x50))(), (uVar8 & 1) == 0)) {
    return 0xf0;
  }
  local_72[0x19] = (**(code **)(*(long *)local_72._26_8_ + 0x20))(local_72._26_8_,1,0);
  local_72[0x19] = local_72[0x19] & 1;
  local_72[0x18] = (**(code **)(*(long *)local_72._26_8_ + 0x20))(local_72._26_8_,2,1);
  local_72[0x18] = local_72[0x18] & 1;
  CVar9 = Session::getState(in_stack_fffffffffffff718);
  local_72._42_8_ = haveRead(CVar9,local_72[0x19],local_72[0x18]);
  if (local_72._42_8_ != 0) {
    if (local_72._42_8_ == 0x101) {
      softHSMLog(6,"C_UnwrapKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x1b53,"User is not authorized");
    }
    return local_72._42_8_;
  }
  if (((*(long *)local_72._82_8_ == 0x2109) || (*(long *)local_72._82_8_ == 0x210a)) &&
     (lVar10 = (**(code **)(*(long *)local_72._26_8_ + 0x28))(local_72._26_8_,0,0x80000000),
     lVar10 != 4)) {
    return 0xf2;
  }
  if ((*(long *)local_72._82_8_ == 0x2109) &&
     (lVar10 = (**(code **)(*(long *)local_72._26_8_ + 0x28))(local_72._26_8_,0x100,0x80000000),
     lVar10 != 0x1f)) {
    return 0xf2;
  }
  if ((*(long *)local_72._82_8_ == 0x210a) &&
     (lVar10 = (**(code **)(*(long *)local_72._26_8_ + 0x28))(local_72._26_8_,0x100,0x80000000),
     lVar10 != 0x1f)) {
    return 0xf2;
  }
  if (((*(long *)local_72._82_8_ == 1) || (*(long *)local_72._82_8_ == 9)) &&
     (lVar10 = (**(code **)(*(long *)local_72._26_8_ + 0x28))(local_72._26_8_,0,0x80000000),
     lVar10 != 3)) {
    return 0xf2;
  }
  if (((*(long *)local_72._82_8_ == 1) || (*(long *)local_72._82_8_ == 9)) &&
     (lVar10 = (**(code **)(*(long *)local_72._26_8_ + 0x28))(local_72._26_8_,0x100,0x80000000),
     lVar10 != 0)) {
    return 0xf2;
  }
  if (((*(long *)local_72._82_8_ == 0x1082) || (*(long *)local_72._82_8_ == 0x1085)) &&
     (lVar10 = (**(code **)(*(long *)local_72._26_8_ + 0x28))(local_72._26_8_,0x100,0x80000000),
     lVar10 != 0x1f)) {
    return 0x115;
  }
  if ((*(long *)local_72._82_8_ == 0x133) &&
     ((lVar10 = (**(code **)(*(long *)local_72._26_8_ + 0x28))(local_72._26_8_,0x100,0x80000000),
      lVar10 != 0x14 ||
      (lVar10 = (**(code **)(*(long *)local_72._26_8_ + 0x28))(local_72._26_8_,0x100,0x80000000),
      lVar10 != 0x15)))) {
    return 0x115;
  }
  bVar1 = (**(code **)(*(long *)local_72._26_8_ + 0x20))(local_72._26_8_,0x107,0);
  if ((bVar1 & 1) == 0) {
    return 0x68;
  }
  bVar2 = isMechanismPermitted
                    (in_stack_fffffffffffff878,(OSObject *)in_stack_fffffffffffff870,
                     in_stack_fffffffffffff868);
  if (!bVar2) {
    return 0x70;
  }
  local_72[1] = '\0';
  local_72[0] = '\x01';
  local_81 = 0;
  this_00 = (Session *)local_72;
  uVar4 = 0;
  local_72._42_8_ =
       extractObjectInformation
                 (in_stack_00000008,in_stack_00000010,(CK_OBJECT_CLASS *)(local_72 + 10),
                  (CK_KEY_TYPE *)(local_72 + 2),&local_80,local_72 + 1,(CK_BBOOL *)this_00,false);
  if (local_72._42_8_ != 0) {
    softHSMLog(3,"C_UnwrapKey",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
               ,0x1b7b,"Mandatory attribute not present in template");
    return local_72._42_8_;
  }
  if ((local_72._10_8_ != 4) && (local_72._10_8_ != 3)) {
    return 0x13;
  }
  CVar9 = Session::getState(this_00);
  local_72._42_8_ = haveWrite(CVar9,local_72[1],local_72[0]);
  if (local_72._42_8_ != 0) {
    if (local_72._42_8_ == 0x101) {
      softHSMLog(6,"C_UnwrapKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x1b89,"User is not authorized");
    }
    if (local_72._42_8_ == 0xb5) {
      softHSMLog(6,"C_UnwrapKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                 ,0x1b8b,"Session is read-only");
    }
    return local_72._42_8_;
  }
  local_90 = 0x20;
  memset(&local_398,0,0x300);
  local_390 = (undefined8 *)(local_72 + 10);
  local_388[0] = 8;
  local_388[1] = 1;
  local_378 = local_72 + 1;
  local_370 = 1;
  local_368 = 2;
  local_360 = local_72;
  local_358 = 1;
  local_350 = 0x100;
  local_348 = local_72 + 2;
  local_340 = 8;
  local_7f8 = local_338;
  do {
    local_7f8 = local_7f8 + 0x18;
  } while (local_7f8 != auStack_98);
  local_3a0 = 4;
  if (0x1c < in_stack_00000010) {
    return 0xd1;
  }
  for (local_3a8 = 0; local_3a8 < in_stack_00000010; local_3a8 = local_3a8 + 1) {
    if ((2 < in_stack_00000008[local_3a8].type) && (in_stack_00000008[local_3a8].type != 0x100)) {
      p_Var15 = in_stack_00000008 + local_3a8;
      (&local_398)[local_3a0 * 3] = p_Var15->type;
      (&local_390)[local_3a0 * 3] = (undefined8 *)p_Var15->pValue;
      local_388[local_3a0 * 3] = p_Var15->ulValueLen;
      local_3a0 = local_3a0 + 1;
    }
  }
  uVar8 = (**(code **)(*(long *)local_72._26_8_ + 0x10))(local_72._26_8_,0x40000212);
  if ((uVar8 & 1) != 0) {
    (**(code **)(*(long *)local_72._26_8_ + 0x18))(&local_448,local_72._26_8_,0x40000212);
    bVar2 = OSAttribute::isAttributeMapAttribute(&local_448);
    if (bVar2) {
      local_460 = OSAttribute::getAttributeMapValue(&local_448);
      local_468._M_node =
           (_Base_ptr)
           std::
           map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
           ::begin((map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
                    *)this_00);
      while( true ) {
        local_470._M_node =
             (_Base_ptr)
             std::
             map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
             ::end((map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
                    *)this_00);
        bVar2 = std::operator!=(&local_468,&local_470);
        if (!bVar2) break;
        local_478 = (CK_ATTRIBUTE_TYPE *)0x0;
        for (local_480 = 0; local_480 < local_3a0; local_480 = local_480 + 1) {
          ppVar11 = std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_OSAttribute>_>::
                    operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_OSAttribute>_>
                                *)CONCAT44(in_stack_fffffffffffff724,uVar4));
          if (ppVar11->first == (&local_398)[local_480 * 3]) {
            if (local_478 != (CK_ATTRIBUTE_TYPE *)0x0) {
              local_8 = 0xd1;
              bVar2 = true;
              goto LAB_0018ac77;
            }
            local_478 = &local_398 + local_480 * 3;
            ByteString::ByteString((ByteString *)0x18aacc);
            std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_OSAttribute>_>::operator->
                      ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_OSAttribute>_> *)
                       CONCAT44(in_stack_fffffffffffff724,uVar4));
            OSAttribute::peekValue
                      (in_stack_fffffffffffff788,
                       (ByteString *)
                       CONCAT17(in_stack_fffffffffffff787,
                                CONCAT16(in_stack_fffffffffffff786,
                                         CONCAT15(in_stack_fffffffffffff785,
                                                  in_stack_fffffffffffff780))));
            sVar13 = local_388[local_480 * 3];
            sVar12 = ByteString::size((ByteString *)0x18ab12);
            if (sVar13 == sVar12) {
              __s1 = (&local_390)[local_480 * 3];
              __s2 = ByteString::const_byte_str((ByteString *)this_00);
              sVar13 = ByteString::size((ByteString *)0x18abab);
              iVar6 = memcmp(__s1,__s2,sVar13);
              if (iVar6 == 0) {
                bVar2 = false;
              }
              else {
                local_8 = 0xd1;
                bVar2 = true;
              }
            }
            else {
              local_8 = 0xd1;
              bVar2 = true;
            }
            ByteString::~ByteString((ByteString *)0x18ac08);
            if (bVar2) goto LAB_0018ac77;
          }
        }
        if (local_478 == (CK_ATTRIBUTE_TYPE *)0x0) {
          local_8 = 0xd1;
          bVar2 = true;
          goto LAB_0018ac77;
        }
        std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_OSAttribute>_>::operator++
                  ((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_OSAttribute>_> *)
                   CONCAT44(in_stack_fffffffffffff724,uVar4));
      }
    }
    bVar2 = false;
LAB_0018ac77:
    OSAttribute::~OSAttribute((OSAttribute *)CONCAT44(in_stack_fffffffffffff724,uVar4));
    if (bVar2) {
      return local_8;
    }
  }
  *in_stack_00000018 = 0;
  ByteString::ByteString
            ((ByteString *)
             CONCAT17(in_stack_fffffffffffff747,
                      CONCAT16(in_stack_fffffffffffff746,
                               CONCAT15(in_stack_fffffffffffff745,
                                        CONCAT14(in_stack_fffffffffffff744,
                                                 CONCAT13(in_stack_fffffffffffff743,
                                                          CONCAT12(in_stack_fffffffffffff742,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff741,
                                                  in_stack_fffffffffffff740))))))),
             (uchar *)CONCAT17(in_stack_fffffffffffff73f,
                               CONCAT16(in_stack_fffffffffffff73e,
                                        CONCAT15(in_stack_fffffffffffff73d,
                                                 CONCAT14(in_stack_fffffffffffff73c,
                                                          in_stack_fffffffffffff738)))),
             in_stack_fffffffffffff730);
  ByteString::ByteString((ByteString *)0x18ace3);
  lVar10 = (**(code **)(*(long *)local_72._26_8_ + 0x28))(local_72._26_8_,0,0x80000000);
  if (lVar10 == 4) {
    local_72._42_8_ =
         UnwrapKeySym(in_stack_fffffffffffff898,in_stack_fffffffffffff890,in_stack_fffffffffffff888,
                      in_stack_fffffffffffff880,(OSObject *)in_stack_fffffffffffff878,
                      in_stack_fffffffffffff870);
  }
  else {
    lVar10 = (**(code **)(*(long *)local_72._26_8_ + 0x28))(local_72._26_8_,0,0x80000000);
    if (lVar10 == 3) {
      local_72._42_8_ =
           UnwrapKeyAsym(in_stack_fffffffffffff768,
                         (CK_MECHANISM_PTR)
                         CONCAT17(in_stack_fffffffffffff767,
                                  CONCAT16(in_stack_fffffffffffff766,in_stack_fffffffffffff760)),
                         in_stack_fffffffffffff758,
                         (Token *)CONCAT17(in_stack_fffffffffffff757,
                                           CONCAT16(in_stack_fffffffffffff756,
                                                    in_stack_fffffffffffff750)),
                         in_stack_fffffffffffff748,
                         (ByteString *)
                         CONCAT17(in_stack_fffffffffffff747,
                                  CONCAT16(in_stack_fffffffffffff746,
                                           CONCAT15(in_stack_fffffffffffff745,
                                                    CONCAT14(in_stack_fffffffffffff744,
                                                             CONCAT13(in_stack_fffffffffffff743,
                                                                      CONCAT12(
                                                  in_stack_fffffffffffff742,
                                                  CONCAT11(in_stack_fffffffffffff741,
                                                           in_stack_fffffffffffff740))))))));
    }
    else {
      local_72._42_8_ = 0xf2;
    }
  }
  if (local_72._42_8_ != 0) goto LAB_0018b670;
  local_72._42_8_ =
       CreateObject(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,
                    in_stack_000000d8,in_stack_000000d4);
  if (local_72._42_8_ == 0) {
    value_00 = (SoftHSM *)
               HandleManager::getObject
                         ((HandleManager *)in_stack_fffffffffffff768,
                          CONCAT17(in_stack_fffffffffffff767,
                                   CONCAT16(in_stack_fffffffffffff766,in_stack_fffffffffffff760)));
    if (value_00 != (SoftHSM *)0x0) {
      uVar5 = (*value_00->_vptr_SoftHSM[10])();
      in_stack_fffffffffffff787 = (undefined1)uVar5;
      if ((uVar5 & 1) != 0) {
        uVar5 = (*value_00->_vptr_SoftHSM[0xb])(value_00,1);
        in_stack_fffffffffffff786 = (undefined1)uVar5;
        if ((uVar5 & 1) == 0) {
          local_72._42_8_ = 6;
        }
        else {
          in_stack_fffffffffffff778 = value_00;
          OSAttribute::OSAttribute
                    ((OSAttribute *)CONCAT44(in_stack_fffffffffffff724,uVar4),
                     SUB81((ulong)this_00 >> 0x38,0));
          bVar1 = 1;
          uVar5 = (*in_stack_fffffffffffff778->_vptr_SoftHSM[8])
                            (in_stack_fffffffffffff778,0x163,&stack0xfffffffffffffa50);
          in_stack_fffffffffffff785 = (undefined1)uVar5;
          if ((bVar1 & 1) != 0) {
            OSAttribute::~OSAttribute((OSAttribute *)CONCAT44(in_stack_fffffffffffff724,uVar4));
          }
          bVar2 = (uVar5 & 1) != 0;
          local_88a = 0;
          if (bVar2) {
            in_stack_fffffffffffff768 = value_00;
            OSAttribute::OSAttribute
                      ((OSAttribute *)CONCAT44(in_stack_fffffffffffff724,uVar4),
                       SUB81((ulong)this_00 >> 0x38,0));
            iVar6 = (*in_stack_fffffffffffff768->_vptr_SoftHSM[8])
                              (in_stack_fffffffffffff768,0x165,local_658);
            in_stack_fffffffffffff767 = (byte)iVar6;
            local_88a = in_stack_fffffffffffff767;
          }
          if (bVar2) {
            OSAttribute::~OSAttribute((OSAttribute *)CONCAT44(in_stack_fffffffffffff724,uVar4));
          }
          local_701 = 0;
          in_stack_fffffffffffff766 = 0;
          if ((local_88a & 1) != 0) {
            pSVar16 = value_00;
            OSAttribute::OSAttribute
                      ((OSAttribute *)CONCAT44(in_stack_fffffffffffff724,uVar4),
                       SUB81((ulong)this_00 >> 0x38,0));
            local_701 = 1;
            iVar6 = (*pSVar16->_vptr_SoftHSM[8])(pSVar16,0x164,local_700);
            in_stack_fffffffffffff757 = (byte)iVar6;
            in_stack_fffffffffffff766 = in_stack_fffffffffffff757;
          }
          bVar3 = in_stack_fffffffffffff766 & 1;
          if ((local_701 & 1) != 0) {
            OSAttribute::~OSAttribute((OSAttribute *)CONCAT44(in_stack_fffffffffffff724,uVar4));
          }
          if (local_72._10_8_ == 4) {
            ByteString::ByteString((ByteString *)0x18b120);
            if (local_72[0] == '\0') {
              ByteString::operator=
                        ((ByteString *)CONCAT44(in_stack_fffffffffffff724,uVar4),
                         (ByteString *)this_00);
            }
            else {
              Token::encrypt((Token *)local_72._34_8_,local_500,(int)local_730);
            }
            bVar1 = 0;
            if (bVar3 != 0) {
              pSVar16 = value_00;
              OSAttribute::OSAttribute
                        ((OSAttribute *)
                         CONCAT17(in_stack_fffffffffffff757,(uint7)in_stack_fffffffffffff750),
                         (ByteString *)value_00);
              iVar6 = (*pSVar16->_vptr_SoftHSM[8])(pSVar16,0x11,local_7d0);
              bVar1 = (byte)iVar6;
            }
            local_509 = (bool)(bVar1 & 1);
            if (bVar3 != 0) {
              OSAttribute::~OSAttribute((OSAttribute *)CONCAT44(in_stack_fffffffffffff724,uVar4));
            }
            ByteString::~ByteString((ByteString *)0x18b2c0);
          }
          else if (local_72._2_8_ == 0) {
            local_509 = false;
            if (bVar3 != 0) {
              local_509 = setRSAPrivateKey(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                                           in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                                           (bool)in_stack_ffffffffffffff0f);
            }
          }
          else if (local_72._2_8_ == 1) {
            local_509 = false;
            if (bVar3 != 0) {
              local_509 = setDSAPrivateKey(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40,
                                           in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,
                                           (bool)in_stack_fffffffffffffb2f);
            }
          }
          else if (local_72._2_8_ == 2) {
            local_509 = false;
            if (bVar3 != 0) {
              local_509 = setDHPrivateKey(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,
                                          (ByteString *)CONCAT17(bVar1,in_stack_fffffffffffffa48),
                                          in_stack_fffffffffffffa40,(bool)in_stack_fffffffffffffa3f)
              ;
            }
          }
          else if (local_72._2_8_ == 3) {
            local_509 = false;
            if (bVar3 != 0) {
              local_509 = setECPrivateKey(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                                          in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                                          (bool)in_stack_fffffffffffff93f);
            }
          }
          else if (local_72._2_8_ == 0x40) {
            local_509 = false;
            if (bVar3 != 0) {
              local_509 = setEDPrivateKey(in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                                          in_stack_fffffffffffff948,in_stack_fffffffffffff940,
                                          (bool)in_stack_fffffffffffff93f);
            }
          }
          else {
            local_509 = false;
          }
          if (local_509 == false) {
            (*value_00->_vptr_SoftHSM[0xd])();
          }
          else {
            iVar6 = (*value_00->_vptr_SoftHSM[0xc])();
            local_509 = (bool)((byte)iVar6 & 1);
          }
          if (local_509 == false) {
            local_72._42_8_ = 6;
          }
        }
        goto LAB_0018b5b9;
      }
    }
    local_72._42_8_ = 6;
  }
LAB_0018b5b9:
  if ((local_72._42_8_ != 0) && (*in_stack_00000018 != 0)) {
    plVar14 = (long *)HandleManager::getObject
                                ((HandleManager *)in_stack_fffffffffffff768,
                                 CONCAT17(in_stack_fffffffffffff767,
                                          CONCAT16(in_stack_fffffffffffff766,
                                                   in_stack_fffffffffffff760)));
    HandleManager::destroyObject
              ((HandleManager *)
               CONCAT17(in_stack_fffffffffffff787,
                        CONCAT16(in_stack_fffffffffffff786,
                                 CONCAT15(in_stack_fffffffffffff785,in_stack_fffffffffffff780))),
               (CK_OBJECT_HANDLE)in_stack_fffffffffffff778);
    if (plVar14 != (long *)0x0) {
      (**(code **)(*plVar14 + 0x70))();
    }
    *in_stack_00000018 = 0;
  }
LAB_0018b670:
  local_8 = local_72._42_8_;
  ByteString::~ByteString((ByteString *)0x18b67d);
  ByteString::~ByteString((ByteString *)0x18b68a);
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_UnwrapKey
(
	CK_SESSION_HANDLE hSession,
	CK_MECHANISM_PTR pMechanism,
	CK_OBJECT_HANDLE hUnwrappingKey,
	CK_BYTE_PTR pWrappedKey,
	CK_ULONG ulWrappedKeyLen,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR hKey
)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pMechanism == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (pWrappedKey == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (pTemplate == NULL_PTR) return CKR_ARGUMENTS_BAD;
	if (hKey == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	CK_RV rv;
	// Check the mechanism
	switch(pMechanism->mechanism)
	{
#ifdef HAVE_AES_KEY_WRAP
		case CKM_AES_KEY_WRAP:
			if ((ulWrappedKeyLen < 24) || ((ulWrappedKeyLen % 8) != 0))
				return CKR_WRAPPED_KEY_LEN_RANGE;
			// Does not handle optional init vector
			if (pMechanism->pParameter != NULL_PTR ||
                            pMechanism->ulParameterLen != 0)
				return CKR_ARGUMENTS_BAD;
			break;
#endif
#ifdef HAVE_AES_KEY_WRAP_PAD
		case CKM_AES_KEY_WRAP_PAD:
			if ((ulWrappedKeyLen < 16) || ((ulWrappedKeyLen % 8) != 0))
				return CKR_WRAPPED_KEY_LEN_RANGE;
			// Does not handle optional init vector
			if (pMechanism->pParameter != NULL_PTR ||
                            pMechanism->ulParameterLen != 0)
				return CKR_ARGUMENTS_BAD;
			break;
#endif
		case CKM_RSA_PKCS:
			// Input length checks needs to be done later when unwrapping key is known
			break;
		case CKM_RSA_PKCS_OAEP:
			rv = MechParamCheckRSAPKCSOAEP(pMechanism);
			if (rv != CKR_OK)
				return rv;
			break;

	        case CKM_AES_CBC_PAD:
			// TODO check block length
			if (pMechanism->pParameter == NULL_PTR ||
                            pMechanism->ulParameterLen != 16)
				return CKR_ARGUMENTS_BAD;
			break;

	        case CKM_DES3_CBC_PAD:
			// TODO check block length
			if (pMechanism->pParameter == NULL_PTR ||
                            pMechanism->ulParameterLen != 8)
				return CKR_ARGUMENTS_BAD;
			break;
			
		default:
			return CKR_MECHANISM_INVALID;
	}

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Check the unwrapping key handle.
	OSObject *unwrapKey = (OSObject *)handleManager->getObject(hUnwrappingKey);
	if (unwrapKey == NULL_PTR || !unwrapKey->isValid()) return CKR_UNWRAPPING_KEY_HANDLE_INVALID;

	CK_BBOOL isUnwrapKeyOnToken = unwrapKey->getBooleanValue(CKA_TOKEN, false);
	CK_BBOOL isUnwrapKeyPrivate = unwrapKey->getBooleanValue(CKA_PRIVATE, true);

	// Check user credentials
	rv = haveRead(session->getState(), isUnwrapKeyOnToken, isUnwrapKeyPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");

		return rv;
	}

	// Check unwrapping key class and type
	if ((pMechanism->mechanism == CKM_AES_KEY_WRAP || pMechanism->mechanism == CKM_AES_KEY_WRAP_PAD) && unwrapKey->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED) != CKO_SECRET_KEY)
		return CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_AES_KEY_WRAP && unwrapKey->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_AES)
		return CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_AES_KEY_WRAP_PAD && unwrapKey->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_AES)
		return CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT;
	if ((pMechanism->mechanism == CKM_RSA_PKCS || pMechanism->mechanism == CKM_RSA_PKCS_OAEP) && unwrapKey->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED) != CKO_PRIVATE_KEY)
		return CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT;
	if ((pMechanism->mechanism == CKM_RSA_PKCS || pMechanism->mechanism == CKM_RSA_PKCS_OAEP) && unwrapKey->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_RSA)
		return CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT;
	if ((pMechanism->mechanism == CKM_AES_CBC || pMechanism->mechanism == CKM_AES_CBC_PAD) && unwrapKey->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_AES)
		return CKR_WRAPPING_KEY_TYPE_INCONSISTENT;
	if (pMechanism->mechanism == CKM_DES3_CBC && (unwrapKey->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_DES2 ||
		unwrapKey->getUnsignedLongValue(CKA_KEY_TYPE, CKK_VENDOR_DEFINED) != CKK_DES3))
		return CKR_WRAPPING_KEY_TYPE_INCONSISTENT;
	
	// Check if the unwrapping key can be used for unwrapping
	if (unwrapKey->getBooleanValue(CKA_UNWRAP, false) == false)
		return CKR_KEY_FUNCTION_NOT_PERMITTED;

	// Check if the specified mechanism is allowed for the unwrap key
	if (!isMechanismPermitted(unwrapKey, pMechanism))
		return CKR_MECHANISM_INVALID;

	// Extract information from the template that is needed to create the object.
	CK_OBJECT_CLASS objClass;
	CK_KEY_TYPE keyType;
	CK_BBOOL isOnToken = CK_FALSE;
	CK_BBOOL isPrivate = CK_TRUE;
	CK_CERTIFICATE_TYPE dummy;
	bool isImplicit = false;
	rv = extractObjectInformation(pTemplate, ulCount, objClass, keyType, dummy, isOnToken, isPrivate, isImplicit);
	if (rv != CKR_OK)
	{
		ERROR_MSG("Mandatory attribute not present in template");
		return rv;
	}

	// Report errors and/or unexpected usage.
	if (objClass != CKO_SECRET_KEY && objClass != CKO_PRIVATE_KEY)
		return CKR_ATTRIBUTE_VALUE_INVALID;
	// Key type will be handled at object creation

	// Check authorization
	rv = haveWrite(session->getState(), isOnToken, isPrivate);
	if (rv != CKR_OK)
	{
		if (rv == CKR_USER_NOT_LOGGED_IN)
			INFO_MSG("User is not authorized");
		if (rv == CKR_SESSION_READ_ONLY)
			INFO_MSG("Session is read-only");

		return rv;
	}

	// Build unwrapped key template
	const CK_ULONG maxAttribs = 32;
	CK_ATTRIBUTE secretAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) }
	};
	CK_ULONG secretAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - secretAttribsCount))
		return CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i = 0; i < ulCount; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
				continue;
			default:
				secretAttribs[secretAttribsCount++] = pTemplate[i];
		}
	}

	// Apply the unwrap template
	if (unwrapKey->attributeExists(CKA_UNWRAP_TEMPLATE))
	{
		OSAttribute unwrapAttr = unwrapKey->getAttribute(CKA_UNWRAP_TEMPLATE);

		if (unwrapAttr.isAttributeMapAttribute())
		{
			typedef std::map<CK_ATTRIBUTE_TYPE,OSAttribute> attrmap_type;

			const attrmap_type& map = unwrapAttr.getAttributeMapValue();

			for (attrmap_type::const_iterator it = map.begin(); it != map.end(); ++it)
			{
				CK_ATTRIBUTE* attr = NULL;
				for (CK_ULONG i = 0; i < secretAttribsCount; ++i)
				{
					if (it->first == secretAttribs[i].type)
					{
						if (attr != NULL)
						{
							return CKR_TEMPLATE_INCONSISTENT;
						}
						attr = &secretAttribs[i];
						ByteString value;
						it->second.peekValue(value);
						if (attr->ulValueLen != value.size())
						{
							return CKR_TEMPLATE_INCONSISTENT;
						}
						if (memcmp(attr->pValue, value.const_byte_str(), value.size()) != 0)
						{
							return CKR_TEMPLATE_INCONSISTENT;
						}
					}
				}
				if (attr == NULL)
				{
					return CKR_TEMPLATE_INCONSISTENT;
				}
			}
		}
	}

	*hKey = CK_INVALID_HANDLE;

	// Unwrap the key
	ByteString wrapped(pWrappedKey, ulWrappedKeyLen);
	ByteString keydata;
	if (unwrapKey->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED) == CKO_SECRET_KEY)
		rv = UnwrapKeySym(pMechanism, wrapped, token, unwrapKey, keydata);
	else if (unwrapKey->getUnsignedLongValue(CKA_CLASS, CKO_VENDOR_DEFINED) == CKO_PRIVATE_KEY)
		rv = UnwrapKeyAsym(pMechanism, wrapped, token, unwrapKey, keydata);
	else
		rv = CKR_UNWRAPPING_KEY_TYPE_INCONSISTENT;
	if (rv != CKR_OK)
		return rv;

	// Create the secret object using C_CreateObject
	rv = this->CreateObject(hSession, secretAttribs, secretAttribsCount, hKey, OBJECT_OP_UNWRAP);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*hKey);
		if (osobject == NULL_PTR || !osobject->isValid())
        {
			rv = CKR_FUNCTION_FAILED;
        }
		else if (osobject->startTransaction())
		{
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL, false);

			// Common Secret Key Attributes
			bOK = bOK && osobject->setAttribute(CKA_ALWAYS_SENSITIVE, false);
			bOK = bOK && osobject->setAttribute(CKA_NEVER_EXTRACTABLE, false);

			// Secret Attributes
			if (objClass == CKO_SECRET_KEY)
			{
				ByteString value;
				if (isPrivate)
					token->encrypt(keydata, value);
				else
					value = keydata;
				bOK = bOK && osobject->setAttribute(CKA_VALUE, value);
			}
			else if (keyType == CKK_RSA)
			{
				bOK = bOK && setRSAPrivateKey(osobject, keydata, token, isPrivate != CK_FALSE);
			}
			else if (keyType == CKK_DSA)
			{
				bOK = bOK && setDSAPrivateKey(osobject, keydata, token, isPrivate != CK_FALSE);
			}
			else if (keyType == CKK_DH)
			{
				bOK = bOK && setDHPrivateKey(osobject, keydata, token, isPrivate != CK_FALSE);
			}
#ifdef WITH_ECC
			else if (keyType == CKK_EC)
			{
				bOK = bOK && setECPrivateKey(osobject, keydata, token, isPrivate != CK_FALSE);
			}
#endif
#ifdef WITH_EDDSA
			else if (keyType == CKK_EC_EDWARDS)
			{
				bOK = bOK && setEDPrivateKey(osobject, keydata, token, isPrivate != CK_FALSE);
			}
#endif
#ifdef WITH_GOST
			else if (keyType == CKK_GOSTR3410)
			{
				bOK = bOK && setGOSTPrivateKey(osobject, keydata, token, isPrivate != CK_FALSE);
			}
#endif
			else
				bOK = false;

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		}
		else
			rv = CKR_FUNCTION_FAILED;
	}

	// Remove secret that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*hKey != CK_INVALID_HANDLE)
		{
			OSObject* obj = (OSObject*)handleManager->getObject(*hKey);
			handleManager->destroyObject(*hKey);
			if (obj) obj->destroyObject();
			*hKey = CK_INVALID_HANDLE;
		}

	}

	return rv;
}